

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O2

void lj_err_optype(lua_State *L,cTValue *o,ErrMsg opm)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uStack_30;
  char *oname;
  
  uVar1 = (o->field_2).it;
  if (uVar1 < 0xffff0000) {
    uStack_30 = 0xd;
  }
  else if ((uVar1 & 0xffff8000) == 0xffff0000) {
    uStack_30 = 3;
  }
  else {
    uStack_30 = (ulong)~uVar1;
  }
  pcVar2 = lj_obj_itypename[uStack_30];
  uVar4 = (ulong)L->base[-1].u32.lo;
  pcVar5 = lj_err_allmsg + (int)opm;
  if (*(char *)(uVar4 + 6) == '\0') {
    oname = (char *)0x0;
    pcVar3 = lj_debug_slotname((GCproto *)((ulong)*(uint *)(uVar4 + 0x10) - 0x40),
                               (BCIns *)((ulong)*(uint *)(((ulong)L->cframe & 0xfffffffffffffffc) +
                                                         0x1c) - 4),
                               (BCReg)((ulong)((long)o - (long)L->base) >> 3),&oname);
    if (pcVar3 != (char *)0x0) {
      err_msgv(L,LJ_ERR_BADOPRT,pcVar5,pcVar3,oname,pcVar2);
    }
  }
  err_msgv(L,LJ_ERR_BADOPRV,pcVar5,pcVar2);
}

Assistant:

LJ_NOINLINE void lj_err_optype(lua_State *L, cTValue *o, ErrMsg opm)
{
  const char *tname = lj_typename(o);
  const char *opname = err2msg(opm);
  if (curr_funcisL(L)) {
    GCproto *pt = curr_proto(L);
    const BCIns *pc = cframe_Lpc(L) - 1;
    const char *oname = NULL;
    const char *kind = lj_debug_slotname(pt, pc, (BCReg)(o-L->base), &oname);
    if (kind)
      err_msgv(L, LJ_ERR_BADOPRT, opname, kind, oname, tname);
  }
  err_msgv(L, LJ_ERR_BADOPRV, opname, tname);
}